

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_TryMergeDrawCmds(ImDrawList *this)

{
  int iVar1;
  ImDrawCmd *pIVar2;
  int iVar3;
  
  pIVar2 = (this->CmdBuffer).Data;
  iVar1 = (this->CmdBuffer).Size;
  iVar3 = bcmp(pIVar2 + (long)iVar1 + -1,pIVar2 + (long)iVar1 + -2,0x1c);
  if (iVar3 == 0) {
    if (((pIVar2[(long)iVar1 + -2].IdxOffset + pIVar2[(long)iVar1 + -2].ElemCount ==
          pIVar2[(long)iVar1 + -1].IdxOffset) &&
        (pIVar2[(long)iVar1 + -1].UserCallback == (ImDrawCallback)0x0)) &&
       (pIVar2[(long)iVar1 + -2].UserCallback == (ImDrawCallback)0x0)) {
      pIVar2[(long)iVar1 + -2].ElemCount =
           pIVar2[(long)iVar1 + -2].ElemCount + pIVar2[(long)iVar1 + -1].ElemCount;
      (this->CmdBuffer).Size = iVar1 + -1;
    }
  }
  return;
}

Assistant:

void ImDrawList::_TryMergeDrawCmds()
{
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (ImDrawCmd_HeaderCompare(curr_cmd, prev_cmd) == 0 && ImDrawCmd_AreSequentialIdxOffset(prev_cmd, curr_cmd) && curr_cmd->UserCallback == NULL && prev_cmd->UserCallback == NULL)
    {
        prev_cmd->ElemCount += curr_cmd->ElemCount;
        CmdBuffer.pop_back();
    }
}